

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

basic_string<char,_eastl::allocator> * __thiscall
eastl::basic_string<char,_eastl::allocator>::append
          (basic_string<char,_eastl::allocator> *this,value_type *pBegin,value_type *pEnd)

{
  uint uVar1;
  value_type *__dest;
  uint uVar2;
  uint uVar3;
  size_t __n;
  value_type *pvVar4;
  ulong __n_00;
  
  if (pBegin != pEnd) {
    pvVar4 = this->mpBegin;
    __n = (long)this->mpEnd - (long)pvVar4;
    __n_00 = (long)pEnd - (long)pBegin;
    uVar2 = ~(uint)pvVar4 + *(int *)&this->mpCapacity;
    uVar1 = (int)__n_00 + (int)__n;
    if (uVar2 < uVar1) {
      uVar3 = 8;
      if (8 < uVar2) {
        uVar3 = uVar2 * 2;
      }
      if (uVar3 <= uVar1) {
        uVar3 = uVar1;
      }
      __dest = (value_type *)malloc((ulong)(uVar3 + 1));
      memmove(__dest,pvVar4,__n);
      pvVar4 = __dest + __n;
      memcpy(pvVar4,pBegin,__n_00);
      pvVar4[__n_00] = '\0';
      DeallocateSelf(this);
      this->mpBegin = __dest;
      this->mpEnd = pvVar4 + __n_00;
      this->mpCapacity = __dest + (uVar3 + 1);
    }
    else {
      memmove(this->mpEnd + 1,pBegin + 1,(long)pEnd - (long)(pBegin + 1));
      this->mpEnd[__n_00 & 0xffffffff] = '\0';
      *this->mpEnd = *pBegin;
      this->mpEnd = this->mpEnd + (__n_00 & 0xffffffff);
    }
  }
  return this;
}

Assistant:

basic_string<T, Allocator>& basic_string<T, Allocator>::append(const value_type* pBegin, const value_type* pEnd)
    {
        if(pBegin != pEnd)
        {
            const size_type nOldSize = (size_type)(mpEnd - mpBegin);
            const size_type n        = (size_type)(pEnd - pBegin);

            #if EASTL_STRING_OPT_LENGTH_ERRORS
                if(EASTL_UNLIKELY(((size_t)n > kMaxSize) || (nOldSize > (kMaxSize - n))))
                    ThrowLengthException();
            #endif

            const size_type nCapacity = (size_type)((mpCapacity - mpBegin) - 1);

            if((nOldSize + n) > nCapacity)
            {
                const size_type nLength = eastl::max_alt((size_type)GetNewCapacity(nCapacity), (size_type)(nOldSize + n)) + 1; // + 1 to accomodate the trailing 0.

                pointer pNewBegin = DoAllocate(nLength);
                pointer pNewEnd   = pNewBegin;

                pNewEnd = CharStringUninitializedCopy(mpBegin, mpEnd, pNewBegin);
                pNewEnd = CharStringUninitializedCopy(pBegin,  pEnd,  pNewEnd);
               *pNewEnd = 0;

                DeallocateSelf();
                mpBegin    = pNewBegin;
                mpEnd      = pNewEnd;
                mpCapacity = pNewBegin + nLength; 
            }
            else
            {
                const value_type* pTemp = pBegin;
                ++pTemp;
                CharStringUninitializedCopy(pTemp, pEnd, mpEnd + 1);
                mpEnd[n] = 0;
               *mpEnd    = *pBegin;
                mpEnd   += n;
            }
        }

        return *this; 
    }